

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webserver.c
# Opt level: O3

char * StrStr(char *s1,char *s2)

{
  __int32_t *p_Var1;
  char *__haystack;
  char *__needle;
  __int32_t **pp_Var2;
  char *pcVar3;
  char *pcVar4;
  char cVar5;
  
  __haystack = strdup(s1);
  if (__haystack == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    __needle = strdup(s2);
    if (__needle == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      cVar5 = *__haystack;
      if (cVar5 != '\0') {
        pp_Var2 = __ctype_toupper_loc();
        p_Var1 = *pp_Var2;
        pcVar4 = __haystack;
        do {
          *pcVar4 = (char)p_Var1[cVar5];
          cVar5 = pcVar4[1];
          pcVar4 = pcVar4 + 1;
        } while (cVar5 != '\0');
      }
      cVar5 = *__needle;
      if (cVar5 != '\0') {
        pp_Var2 = __ctype_toupper_loc();
        p_Var1 = *pp_Var2;
        pcVar4 = __needle;
        do {
          *pcVar4 = (char)p_Var1[cVar5];
          cVar5 = pcVar4[1];
          pcVar4 = pcVar4 + 1;
        } while (cVar5 != '\0');
      }
      pcVar3 = strstr(__haystack,__needle);
      pcVar4 = s1 + ((long)pcVar3 - (long)__haystack);
      if (pcVar3 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      free(__needle);
    }
    free(__haystack);
  }
  return pcVar4;
}

Assistant:

static char *StrStr(
	/*! Input string. */
	char *s1,
	/*! Input sub-string. */
	const char *s2)
{
	char *Str1;
	char *Str2;
	const char *Ptr;
	char *ret = NULL;

	Str1 = strdup(s1);
	if (!Str1)
		goto error1;
	Str2 = strdup(s2);
	if (!Str2)
		goto error2;
	ToUpperCase(Str1);
	ToUpperCase(Str2);
	Ptr = strstr(Str1, Str2);
	if (!Ptr)
		ret = NULL;
	else
		ret = s1 + (Ptr - Str1);

	free(Str2);
error2:
	free(Str1);
error1:
	return ret;
}